

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O2

int ON_BrepExtrudeVertex(ON_Brep *brep,int vertex_index,ON_Curve *path_curve)

{
  ON_BrepVertex *pOVar1;
  ON_3dPoint vertex_point;
  bool bVar2;
  int iVar3;
  ON_Curve *this;
  ON_BrepVertex *v1;
  ON_BrepEdge *pOVar4;
  ON_3dPoint *this_00;
  ON_3dVector path_vector;
  ON_3dPoint local_78;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  iVar3 = 0;
  if ((-1 < vertex_index) ||
     (vertex_index <
      (brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count)) {
    bVar2 = ON_BrepExtrudeHelper_CheckPathCurve(path_curve,&path_vector);
    if (bVar2) {
      this = ON_Curve::Duplicate(path_curve);
      ON_ClassArray<ON_BrepVertex>::Reserve
                ((ON_ClassArray<ON_BrepVertex> *)&brep->m_V,
                 (long)(brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                       super_ON_ClassArray<ON_BrepVertex>.m_count + 1);
      pOVar1 = (brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_a;
      this_00 = &pOVar1[vertex_index].super_ON_Point.point;
      ON_3dPoint::operator+(&local_48,this_00,&path_vector);
      vertex_point.y = local_48.y;
      vertex_point.x = local_48.x;
      vertex_point.z = local_48.z;
      v1 = ON_Brep::NewVertex(brep,vertex_point,0.0);
      ON_Curve::PointAtStart(&local_78,this);
      ON_3dPoint::operator-(&local_60,this_00,&local_78);
      ON_Geometry::Translate(&this->super_ON_Geometry,&local_60);
      iVar3 = ON_Brep::AddEdgeCurve(brep,this);
      pOVar4 = ON_Brep::NewEdge(brep,pOVar1 + vertex_index,v1,iVar3,(ON_Interval *)0x0,
                                -1.23432101234321e+308);
      pOVar4->m_tolerance = 0.0;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int ON_BrepExtrudeVertex( 
          ON_Brep& brep,
          int vertex_index,
          const ON_Curve& path_curve
          )
{
  ON_3dVector path_vector;
  if ( vertex_index < 0 && vertex_index >= brep.m_V.Count() )
    return false;
  if ( !ON_BrepExtrudeHelper_CheckPathCurve(path_curve,path_vector) )
    return false;
  ON_Curve* c3 = path_curve.Duplicate();
  brep.m_V.Reserve( brep.m_V.Count() + 1 );
  ON_BrepVertex& v0 = brep.m_V[vertex_index];
  ON_BrepVertex& v1 = brep.NewVertex( v0.point + path_vector, 0.0 );
  c3->Translate( v0.point - c3->PointAtStart() );
  int c3i = brep.AddEdgeCurve( c3 );
  ON_BrepEdge& edge = brep.NewEdge( v0, v1, c3i );
  edge.m_tolerance = 0.0;
  return true;
}